

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O1

void __thiscall
AlternativeLoader::altSplitLine
          (AlternativeLoader *this,string *line,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pLineWords,string *mode)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  string delimiter;
  string mLine;
  string token;
  undefined1 *local_b0;
  char *local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  value_type local_90;
  value_type local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (line->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + line->_M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_b0 = &local_a0;
  local_a8 = (char *)0x0;
  local_a0 = 0;
  iVar2 = std::__cxx11::string::compare((char *)mode);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)mode);
    if (iVar2 != 0) {
      std::__cxx11::string::_M_replace((ulong)&local_b0,0,local_a8,0x1093a7);
      while( true ) {
        lVar3 = std::__cxx11::string::find((char *)&local_90,(ulong)local_b0,0);
        if (lVar3 == -1) break;
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
        std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pLineWords,&local_70);
        std::__cxx11::string::erase((ulong)&local_90,0);
      }
      goto LAB_00104461;
    }
  }
  std::__cxx11::string::_M_replace((ulong)&local_b0,0,local_a8,0x1093a5);
  while( true ) {
    lVar3 = std::__cxx11::string::find((char *)&local_90,(ulong)local_b0,0);
    if (lVar3 == -1) break;
    std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pLineWords,&local_70);
    std::__cxx11::string::erase((ulong)&local_90,0);
  }
LAB_00104461:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pLineWords,&local_90);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AlternativeLoader::altSplitLine(const std::string &line, std::vector<std::string> *pLineWords, const std::string& mode) {
    std::string mLine = line;
    size_t pos;
    std::string token;
    std::string delimiter;
    if(mode == "Map" || mode == "Continents"){
        //split each line into vector of words (split by =)
        delimiter = "=";
        while((pos = mLine.find(delimiter)) != std::string::npos){
            token = mLine.substr(0,pos);
            pLineWords->push_back(token);
            mLine.erase(0,pos + delimiter.length());
        }
        pLineWords->push_back(mLine);
    }else{
        //split each line into vector of words (split by ,)
        delimiter = ",";
        while((pos = mLine.find(delimiter)) != std::string::npos){
            token = mLine.substr(0,pos);
            pLineWords->push_back(token);
            mLine.erase(0,pos + delimiter.length());
        }
        pLineWords->push_back(mLine);
    }
}